

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O3

_Bool mfb_wait_sync(mfb_window *window)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  double dVar5;
  XEvent event;
  XEvent XStack_e8;
  
  if (window == (mfb_window *)0x0) {
    return false;
  }
  if (window[0x2aa] == (mfb_window)0x1) {
LAB_00103efa:
    destroy_window_data((SWindowData *)window);
    _Var2 = false;
  }
  else {
    _Var2 = true;
    if (!g_use_hardware_sync) {
      lVar1 = *(long *)window;
      XFlush(*(undefined8 *)(lVar1 + 8));
      dVar5 = mfb_timer_now(*(mfb_timer **)(lVar1 + 0x30));
      if (dVar5 < g_time_for_frame * 0.96) {
        iVar4 = 1;
        do {
          if (g_time_for_frame * 0.8 <= dVar5) {
            iVar4 = 0;
          }
          usleep(iVar4 * 1000);
          if (iVar4 == 1) {
            iVar3 = XEventsQueued(*(undefined8 *)(lVar1 + 8),0);
            if (0 < iVar3) {
              XNextEvent(*(undefined8 *)(lVar1 + 8),&XStack_e8);
              processEvent((SWindowData *)window,&XStack_e8);
              if (window[0x2aa] == (mfb_window)0x1) goto LAB_00103efa;
            }
          }
          dVar5 = mfb_timer_now(*(mfb_timer **)(lVar1 + 0x30));
        } while (dVar5 < g_time_for_frame * 0.96);
      }
      mfb_timer_reset(*(mfb_timer **)(lVar1 + 0x30));
      _Var2 = true;
    }
  }
  return _Var2;
}

Assistant:

bool
mfb_wait_sync(struct mfb_window *window) {
    if (window == 0x0) {
        return false;
    }

    SWindowData *window_data = (SWindowData *) window;
    if (window_data->close) {
        destroy_window_data(window_data);
        return false;
    }

    if(g_use_hardware_sync) {
        return true;
    }

    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
    XFlush(window_data_x11->display);
    XEvent      event;
    double      current;
    uint32_t    millis = 1;
    while(1) {
        current = mfb_timer_now(window_data_x11->timer);
        if (current >= g_time_for_frame * 0.96) {
            mfb_timer_reset(window_data_x11->timer);
            return true;
        }
        else if(current >= g_time_for_frame * 0.8) {
            millis = 0;
        }

        usleep(millis * 1000);
        //sched_yield();

        if(millis == 1 && XEventsQueued(window_data_x11->display, QueuedAlready) > 0) {
            XNextEvent(window_data_x11->display, &event);
            processEvent(window_data, &event);

            if(window_data->close) {
                destroy_window_data(window_data);
                return false;
            }
        }
    }

    return true;
}